

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O3

CustomExternalWrapperObject *
Js::CustomExternalWrapperObject::Create
          (void *data,uint inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsGetterSetterInterceptor **getterSetterInterceptor,
          RecyclableObject *prototype,ScriptContext *scriptContext)

{
  Type interceptors;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  CustomExternalWrapperType *this;
  undefined4 *puVar4;
  Recycler *pRVar5;
  CustomExternalWrapperObject *this_00;
  type_info *ptVar6;
  undefined1 local_68 [8];
  TrackAllocData data_1;
  
  data_1._32_8_ = data;
  if (prototype == (RecyclableObject *)0x0) {
    prototype = &JavascriptLibraryBase::GetObjectPrototype
                           (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                             super_JavascriptLibraryBase)->super_RecyclableObject;
  }
  this = (CustomExternalWrapperType *)
         JavascriptLibrary::GetCachedCustomExternalWrapperType
                   ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                    (uintptr_t)traceCallback,(uintptr_t)finalizeCallback,
                    (uintptr_t)*getterSetterInterceptor,(uintptr_t)prototype);
  if (this == (CustomExternalWrapperType *)0x0) {
    local_68 = (undefined1  [8])&CustomExternalWrapperType::typeinfo;
    data_1.typeinfo = (type_info *)0x0;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_620f76e;
    data_1.filename._0_4_ = 0x4f;
    pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
    this = (CustomExternalWrapperType *)new<Memory::Recycler>(0x50,pRVar5,0x387914);
    CustomExternalWrapperType::CustomExternalWrapperType
              (this,scriptContext,traceCallback,finalizeCallback,prototype);
    interceptors = this->jsGetterSetterInterceptor;
    *getterSetterInterceptor = interceptors;
    JavascriptLibrary::CacheCustomExternalWrapperType
              ((scriptContext->super_ScriptContextBase).javascriptLibrary,(uintptr_t)traceCallback,
               (uintptr_t)finalizeCallback,(uintptr_t)interceptors,(uintptr_t)prototype,
               (DynamicType *)this);
  }
  else if (*getterSetterInterceptor == (JsGetterSetterInterceptor *)0x0) {
    *getterSetterInterceptor = this->jsGetterSetterInterceptor;
  }
  else if (*getterSetterInterceptor != this->jsGetterSetterInterceptor) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x5b,
                                "(*getterSetterInterceptor == reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor())"
                                ,
                                "*getterSetterInterceptor == reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor()"
                               );
    if (!bVar2) goto LAB_00b2fe15;
    *puVar4 = 0;
  }
  if (((this->super_DynamicType).super_Type.flags & TypeFlagMask_JsrtExternal) == TypeFlagMask_None)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x5f,"(dynamicType->IsJsrtExternal())",
                                "dynamicType->IsJsrtExternal()");
    if (!bVar2) goto LAB_00b2fe15;
    *puVar4 = 0;
  }
  ptVar6 = (type_info *)(ulong)inlineSlotSize;
  data_1.typeinfo = ptVar6;
  if (traceCallback == (JsTraceCallback)0x0) {
    if (finalizeCallback == (JsFinalizeCallback)0x0) {
      local_68 = (undefined1  [8])&typeinfo;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_620f76e;
      data_1.filename._0_4_ = 0x6c;
      pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00b2fe15;
        *puVar4 = 0;
      }
      this_00 = (CustomExternalWrapperObject *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                          (pRVar5,(size_t)(ptVar6 + 0x30));
    }
    else {
      local_68 = (undefined1  [8])&typeinfo;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_620f76e;
      data_1.filename._0_4_ = 0x68;
      pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00b2fe15;
        *puVar4 = 0;
      }
      this_00 = (CustomExternalWrapperObject *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)388,false>
                          (pRVar5,(size_t)(ptVar6 + 0x30));
    }
  }
  else {
    local_68 = (undefined1  [8])&typeinfo;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_620f76e;
    data_1.filename._0_4_ = 100;
    pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00b2fe15;
      *puVar4 = 0;
    }
    this_00 = (CustomExternalWrapperObject *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1428,false>
                        (pRVar5,(size_t)(ptVar6 + 0x30));
  }
  if (this_00 == (CustomExternalWrapperObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00b2fe15:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  CustomExternalWrapperObject(this_00,this,(void *)data_1._32_8_,inlineSlotSize);
  return this_00;
}

Assistant:

CustomExternalWrapperObject* CustomExternalWrapperObject::Create(void *data, uint inlineSlotSize, JsTraceCallback traceCallback, JsFinalizeCallback finalizeCallback, JsGetterSetterInterceptor ** getterSetterInterceptor, Js::RecyclableObject * prototype, Js::ScriptContext *scriptContext)
{
    if (prototype == nullptr)
    {
        prototype = scriptContext->GetLibrary()->GetObjectPrototype();
    }

    Js::DynamicType * dynamicType = scriptContext->GetLibrary()->GetCachedCustomExternalWrapperType(reinterpret_cast<uintptr_t>(traceCallback), reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(*getterSetterInterceptor), reinterpret_cast<uintptr_t>(prototype));
    if (dynamicType == nullptr)
    {
        dynamicType = RecyclerNew(scriptContext->GetRecycler(), CustomExternalWrapperType, scriptContext, traceCallback, finalizeCallback, prototype);
        *getterSetterInterceptor = reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor();
        scriptContext->GetLibrary()->CacheCustomExternalWrapperType(reinterpret_cast<uintptr_t>(traceCallback), reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(*getterSetterInterceptor), reinterpret_cast<uintptr_t>(prototype), dynamicType);
    }
    else
    {
        if (*getterSetterInterceptor == nullptr)
        {
            *getterSetterInterceptor = reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor();
        }
        else
        {
            Assert(*getterSetterInterceptor == reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor());
        }
    }

    Assert(dynamicType->IsJsrtExternal());

    CustomExternalWrapperObject * externalObject;
    if (traceCallback != nullptr)
    {
        externalObject = RecyclerNewTrackedPlus(scriptContext->GetRecycler(), inlineSlotSize, CustomExternalWrapperObject, static_cast<CustomExternalWrapperType*>(dynamicType), data, inlineSlotSize);
    }
    else if (finalizeCallback != nullptr)
    {
        externalObject = RecyclerNewFinalizedPlus(scriptContext->GetRecycler(), inlineSlotSize, CustomExternalWrapperObject, static_cast<CustomExternalWrapperType*>(dynamicType), data, inlineSlotSize);
    }
    else
    {
        externalObject = RecyclerNewPlus(scriptContext->GetRecycler(), inlineSlotSize, CustomExternalWrapperObject, static_cast<CustomExternalWrapperType*>(dynamicType), data, inlineSlotSize);
    }

    return externalObject;
}